

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

void Jf_ManSetDefaultPars(Jf_Par_t *pPars)

{
  memset(&pPars->nProcNum,0,0x100);
  pPars->nLutSize = 6;
  pPars->nCutNum = 8;
  pPars->nRounds = 1;
  pPars->nVerbLimit = 5;
  pPars->DelayTarget = -1;
  pPars->fAreaOnly = 1;
  pPars->fOptEdge = 1;
  pPars->fVerbose = 0;
  pPars->fCoarsen = 0;
  pPars->fCutMin = 0;
  pPars->fFuncDsd = 0;
  pPars->fGenCnf = 0;
  pPars->nLutSizeMax = 8;
  pPars->nCutNumMax = 0x10;
  return;
}

Assistant:

void Jf_ManSetDefaultPars( Jf_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Jf_Par_t) );
    pPars->nLutSize     =  6;
    pPars->nCutNum      =  8;
    pPars->nRounds      =  1;
    pPars->nVerbLimit   =  5;
    pPars->DelayTarget  = -1;
    pPars->fAreaOnly    =  1;
    pPars->fOptEdge     =  1; 
    pPars->fCoarsen     =  0;
    pPars->fCutMin      =  0;
    pPars->fFuncDsd     =  0;
    pPars->fGenCnf      =  0;
    pPars->fPureAig     =  0;
    pPars->fVerbose     =  0;
    pPars->fVeryVerbose =  0;
    pPars->nLutSizeMax  =  JF_LEAF_MAX;
    pPars->nCutNumMax   =  JF_CUT_MAX;
}